

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O3

void aom_highbd_comp_mask_pred_avx2
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined1 (*pauVar1) [32];
  ulong *puVar2;
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  
  pauVar3 = (undefined1 (*) [32])((long)comp_pred8 * 2);
  iVar5 = ref_stride;
  iVar7 = width;
  pauVar1 = (undefined1 (*) [32])((long)pred8 * 2);
  pauVar4 = (undefined1 (*) [32])((long)ref8 * 2);
  if (invert_mask == 0) {
    iVar5 = width;
    iVar7 = ref_stride;
    pauVar1 = (undefined1 (*) [32])((long)ref8 * 2);
    pauVar4 = (undefined1 (*) [32])((long)pred8 * 2);
  }
  lVar6 = (long)iVar7;
  if (width == 8) {
    puVar2 = (ulong *)(mask + 8);
    iVar8 = 0;
    auVar12._8_2_ = 0x40;
    auVar12._0_8_ = 0x40004000400040;
    auVar12._10_2_ = 0x40;
    auVar12._12_2_ = 0x40;
    auVar12._14_2_ = 0x40;
    auVar12._16_2_ = 0x40;
    auVar12._18_2_ = 0x40;
    auVar12._20_2_ = 0x40;
    auVar12._22_2_ = 0x40;
    auVar12._24_2_ = 0x40;
    auVar12._26_2_ = 0x40;
    auVar12._28_2_ = 0x40;
    auVar12._30_2_ = 0x40;
    auVar14._8_4_ = 0x20;
    auVar14._0_8_ = 0x2000000020;
    auVar14._12_4_ = 0x20;
    auVar14._16_4_ = 0x20;
    auVar14._20_4_ = 0x20;
    auVar14._24_4_ = 0x20;
    auVar14._28_4_ = 0x20;
    do {
      auVar20._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar6 * 2) +
           ZEXT116(1) * *(undefined1 (*) [16])*pauVar1;
      auVar20._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar6 * 2);
      auVar15._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*pauVar4 + (long)iVar5 * 2) +
           ZEXT116(1) * *(undefined1 (*) [16])*pauVar4;
      auVar15._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar4 + (long)iVar5 * 2);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *puVar2;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = puVar2[-1];
      auVar13._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar16;
      auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
      auVar11 = vpunpcklbw_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar18 = vpsubw_avx2(auVar12,auVar11);
      auVar13 = vpunpcklwd_avx2(auVar20,auVar15);
      auVar19 = vpunpcklwd_avx2(auVar11,auVar18);
      auVar13 = vpmaddwd_avx2(auVar19,auVar13);
      auVar13 = vpaddd_avx2(auVar13,auVar14);
      auVar19 = vpsrad_avx2(auVar13,6);
      auVar13 = vpunpckhwd_avx2(auVar20,auVar15);
      auVar18 = vpunpckhwd_avx2(auVar11,auVar18);
      auVar13 = vpmaddwd_avx2(auVar13,auVar18);
      auVar13 = vpaddd_avx2(auVar13,auVar14);
      auVar13 = vpsrad_avx2(auVar13,6);
      auVar13 = vpackssdw_avx2(auVar19,auVar13);
      *pauVar3 = auVar13;
      pauVar3 = pauVar3 + 1;
      iVar8 = iVar8 + 2;
      pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)(iVar5 * 2) * 2);
      pauVar1 = (undefined1 (*) [32])(*pauVar1 + (long)(iVar7 * 2) * 2);
      puVar2 = (ulong *)((long)puVar2 + (long)(mask_stride * 2));
    } while (iVar8 < height);
  }
  else if (width == 0x10) {
    iVar7 = 1;
    if (1 < height) {
      iVar7 = height;
    }
    auVar19._8_2_ = 0x40;
    auVar19._0_8_ = 0x40004000400040;
    auVar19._10_2_ = 0x40;
    auVar19._12_2_ = 0x40;
    auVar19._14_2_ = 0x40;
    auVar19._16_2_ = 0x40;
    auVar19._18_2_ = 0x40;
    auVar19._20_2_ = 0x40;
    auVar19._22_2_ = 0x40;
    auVar19._24_2_ = 0x40;
    auVar19._26_2_ = 0x40;
    auVar19._28_2_ = 0x40;
    auVar19._30_2_ = 0x40;
    auVar10._8_4_ = 0x20;
    auVar10._0_8_ = 0x2000000020;
    auVar10._12_4_ = 0x20;
    auVar10._16_4_ = 0x20;
    auVar10._20_4_ = 0x20;
    auVar10._24_4_ = 0x20;
    auVar10._28_4_ = 0x20;
    do {
      auVar14 = vpmovzxbw_avx2(*(undefined1 (*) [16])mask);
      auVar13 = vpsubw_avx2(auVar19,auVar14);
      auVar12 = vpunpcklwd_avx2(*pauVar1,*pauVar4);
      auVar18 = vpunpcklwd_avx2(auVar14,auVar13);
      auVar12 = vpmaddwd_avx2(auVar12,auVar18);
      auVar12 = vpaddd_avx2(auVar12,auVar10);
      auVar18 = vpsrad_avx2(auVar12,6);
      auVar12 = vpunpckhwd_avx2(*pauVar1,*pauVar4);
      auVar14 = vpunpckhwd_avx2(auVar14,auVar13);
      auVar12 = vpmaddwd_avx2(auVar12,auVar14);
      auVar12 = vpaddd_avx2(auVar12,auVar10);
      auVar12 = vpsrad_avx2(auVar12,6);
      auVar12 = vpackssdw_avx2(auVar18,auVar12);
      *pauVar3 = auVar12;
      mask = *(undefined1 (*) [16])mask + mask_stride;
      pauVar3 = pauVar3 + 1;
      pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)iVar5 * 2);
      pauVar1 = (undefined1 (*) [32])(*pauVar1 + lVar6 * 2);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  else {
    iVar7 = 1;
    if (1 < height) {
      iVar7 = height;
    }
    iVar8 = 0;
    auVar18._8_2_ = 0x40;
    auVar18._0_8_ = 0x40004000400040;
    auVar18._10_2_ = 0x40;
    auVar18._12_2_ = 0x40;
    auVar18._14_2_ = 0x40;
    auVar18._16_2_ = 0x40;
    auVar18._18_2_ = 0x40;
    auVar18._20_2_ = 0x40;
    auVar18._22_2_ = 0x40;
    auVar18._24_2_ = 0x40;
    auVar18._26_2_ = 0x40;
    auVar18._28_2_ = 0x40;
    auVar18._30_2_ = 0x40;
    auVar11._8_4_ = 0x20;
    auVar11._0_8_ = 0x2000000020;
    auVar11._12_4_ = 0x20;
    auVar11._16_4_ = 0x20;
    auVar11._20_4_ = 0x20;
    auVar11._24_4_ = 0x20;
    auVar11._28_4_ = 0x20;
    do {
      if (0 < width) {
        lVar9 = 0;
        do {
          auVar14 = vpmovzxbw_avx2(*(undefined1 (*) [16])(mask + lVar9));
          auVar13 = vpmovzxbw_avx2(*(undefined1 (*) [16])(mask + lVar9 + 0x10));
          auVar19 = vpsubw_avx2(auVar18,auVar14);
          auVar12 = vpunpcklwd_avx2(*(undefined1 (*) [32])(*pauVar1 + lVar9 * 2),
                                    *(undefined1 (*) [32])(*pauVar4 + lVar9 * 2));
          auVar20 = vpunpcklwd_avx2(auVar14,auVar19);
          auVar12 = vpmaddwd_avx2(auVar12,auVar20);
          auVar12 = vpaddd_avx2(auVar12,auVar11);
          auVar20 = vpsrad_avx2(auVar12,6);
          auVar12 = vpunpckhwd_avx2(*(undefined1 (*) [32])(*pauVar1 + lVar9 * 2),
                                    *(undefined1 (*) [32])(*pauVar4 + lVar9 * 2));
          auVar14 = vpunpckhwd_avx2(auVar14,auVar19);
          auVar12 = vpmaddwd_avx2(auVar12,auVar14);
          auVar12 = vpaddd_avx2(auVar12,auVar11);
          auVar12 = vpsrad_avx2(auVar12,6);
          auVar12 = vpackssdw_avx2(auVar20,auVar12);
          auVar19 = vpsubw_avx2(auVar18,auVar13);
          auVar14 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar1[1] + lVar9 * 2),
                                    *(undefined1 (*) [32])(pauVar4[1] + lVar9 * 2));
          auVar20 = vpunpcklwd_avx2(auVar13,auVar19);
          auVar14 = vpmaddwd_avx2(auVar20,auVar14);
          auVar14 = vpaddd_avx2(auVar14,auVar11);
          auVar20 = vpsrad_avx2(auVar14,6);
          auVar14 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar1[1] + lVar9 * 2),
                                    *(undefined1 (*) [32])(pauVar4[1] + lVar9 * 2));
          auVar13 = vpunpckhwd_avx2(auVar13,auVar19);
          auVar14 = vpmaddwd_avx2(auVar14,auVar13);
          auVar14 = vpaddd_avx2(auVar14,auVar11);
          auVar14 = vpsrad_avx2(auVar14,6);
          auVar14 = vpackssdw_avx2(auVar20,auVar14);
          *pauVar3 = auVar12;
          pauVar3[1] = auVar14;
          pauVar3 = pauVar3 + 2;
          lVar9 = lVar9 + 0x20;
        } while (lVar9 < width);
      }
      mask = mask + mask_stride;
      iVar8 = iVar8 + 1;
      pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)iVar5 * 2);
      pauVar1 = (undefined1 (*) [32])(*pauVar1 + lVar6 * 2);
    } while (iVar8 != iVar7);
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_avx2(uint8_t *comp_pred8, const uint8_t *pred8,
                                    int width, int height, const uint8_t *ref8,
                                    int ref_stride, const uint8_t *mask,
                                    int mask_stride, int invert_mask) {
  int i = 0;
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  const uint16_t *src0 = invert_mask ? pred : ref;
  const uint16_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  const __m256i zero = _mm256_setzero_si256();

  if (width == 8) {
    do {
      const __m256i s0 = mm256_loadu2_16(src0 + stride0, src0);
      const __m256i s1 = mm256_loadu2_16(src1 + stride1, src1);

      const __m128i m_l = _mm_loadl_epi64((const __m128i *)mask);
      const __m128i m_h = _mm_loadl_epi64((const __m128i *)(mask + 8));

      __m256i m = _mm256_castsi128_si256(m_l);
      m = _mm256_insertf128_si256(m, m_h, 1);
      const __m256i m_16 = _mm256_unpacklo_epi8(m, zero);

      const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m_16);

      _mm_storeu_si128((__m128i *)(comp_pred), _mm256_castsi256_si128(comp));

      _mm_storeu_si128((__m128i *)(comp_pred + width),
                       _mm256_extractf128_si256(comp, 1));

      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      comp_pred += (width << 1);
      i += 2;
    } while (i < height);
  } else if (width == 16) {
    do {
      const __m256i s0 = _mm256_loadu_si256((const __m256i *)(src0));
      const __m256i s1 = _mm256_loadu_si256((const __m256i *)(src1));
      const __m256i m_16 =
          _mm256_cvtepu8_epi16(_mm_loadu_si128((const __m128i *)mask));

      const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m_16);

      _mm256_storeu_si256((__m256i *)comp_pred, comp);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        const __m256i s0 = _mm256_loadu_si256((const __m256i *)(src0 + x));
        const __m256i s2 = _mm256_loadu_si256((const __m256i *)(src0 + x + 16));
        const __m256i s1 = _mm256_loadu_si256((const __m256i *)(src1 + x));
        const __m256i s3 = _mm256_loadu_si256((const __m256i *)(src1 + x + 16));

        const __m256i m01_16 =
            _mm256_cvtepu8_epi16(_mm_loadu_si128((const __m128i *)(mask + x)));
        const __m256i m23_16 = _mm256_cvtepu8_epi16(
            _mm_loadu_si128((const __m128i *)(mask + x + 16)));

        const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m01_16);
        const __m256i comp1 = highbd_comp_mask_pred_line_avx2(s2, s3, m23_16);

        _mm256_storeu_si256((__m256i *)comp_pred, comp);
        _mm256_storeu_si256((__m256i *)(comp_pred + 16), comp1);

        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i += 1;
    } while (i < height);
  }
}